

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

bool __thiscall argh::parser::is_option(parser *this,string *arg)

{
  bool bVar1;
  
  if (arg->_M_string_length != 0) {
    bVar1 = is_number(this,arg);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = *(arg->_M_dataplus)._M_p == '-';
    }
    return bVar1;
  }
  __assert_fail("0 != arg.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fzyukio[P]cspade-full/argh.h"
                ,0x11a,"bool argh::parser::is_option(const std::string &) const");
}

Assistant:

inline bool parser::is_option(std::string const &arg) const {
        assert(0 != arg.size());
        if (is_number(arg))
            return false;
        return '-' == arg[0];
    }